

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

void ** CP_consolidateDataToAll
                  (SstStream Stream,void *LocalInfo,FFSTypeHandle Type,void **RetDataBlock)

{
  SMPI_Datatype recvtype;
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  SMPI_Comm comm;
  undefined8 *sendbuf;
  void *pvVar4;
  void **ppvVar5;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  FFSContext context;
  int round_up;
  int TotalLen;
  int i;
  char *RecvBuffer;
  size_t *Displs;
  _CP_DP_init_info **Pointers;
  char *Buffer;
  size_t *RecvCounts;
  size_t DataSize;
  FFSBuffer Buf;
  size_t *in_stack_ffffffffffffff90;
  SMPI_Datatype in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar6;
  SMPI_Comm in_stack_ffffffffffffffb0;
  undefined1 local_30 [8];
  undefined8 local_28;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 local_10;
  long *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar2 = create_FFSBuffer();
  local_28 = uVar2;
  uVar3 = FMFormat_of_original(local_18);
  recvtype = FFSencode(uVar2,uVar3,local_10,local_30);
  comm = (SMPI_Comm)malloc((long)*(int *)((long)local_8 + 0xac) << 3);
  SMPI_Allgather((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 (int)((ulong)uVar2 >> 0x20),(SMPI_Datatype)uVar2,in_stack_ffffffffffffffb0);
  sendbuf = (undefined8 *)malloc((long)*(int *)((long)local_8 + 0xac) << 3);
  *sendbuf = 0;
  uVar1 = (int)*(undefined8 *)comm + 7U & 0xfffffff8;
  for (iVar6 = 1; iVar6 < *(int *)((long)local_8 + 0xac); iVar6 = iVar6 + 1) {
    in_stack_ffffffffffffff9c = (int)*(undefined8 *)(comm + (long)iVar6 * 8) + 7U & 0xfffffff8;
    sendbuf[iVar6] = (long)(int)uVar1;
    uVar1 = in_stack_ffffffffffffff9c + uVar1;
  }
  pvVar4 = malloc((long)(int)uVar1);
  SMPI_Allgatherv(sendbuf,(int)((ulong)pvVar4 >> 0x20),(SMPI_Datatype)pvVar4,
                  (void *)CONCAT44(iVar6,uVar1),
                  (size_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                  in_stack_ffffffffffffff90,recvtype,comm);
  free_FFSBuffer(local_28);
  uVar2 = *(undefined8 *)(*local_8 + 8);
  ppvVar5 = (void **)malloc((long)*(int *)((long)local_8 + 0xac) << 3);
  for (iVar6 = 0; iVar6 < *(int *)((long)local_8 + 0xac); iVar6 = iVar6 + 1) {
    FFSdecode_in_place(uVar2,(long)pvVar4 + sendbuf[iVar6],ppvVar5 + iVar6);
  }
  free(sendbuf);
  free(comm);
  *local_20 = pvVar4;
  return ppvVar5;
}

Assistant:

void **CP_consolidateDataToAll(SstStream Stream, void *LocalInfo, FFSTypeHandle Type,
                               void **RetDataBlock)
{
    FFSBuffer Buf = create_FFSBuffer();
    size_t DataSize;
    size_t *RecvCounts;
    char *Buffer;

    struct _CP_DP_init_info **Pointers = NULL;

    Buffer = FFSencode(Buf, FMFormat_of_original(Type), LocalInfo, &DataSize);

    RecvCounts = malloc(Stream->CohortSize * sizeof(*RecvCounts));

    SMPI_Allgather(&DataSize, 1, SMPI_SIZE_T, RecvCounts, 1, SMPI_SIZE_T, Stream->mpiComm);

    /*
     * Figure out the total length of block
     * and displacements for each rank
     */

    size_t *Displs;
    char *RecvBuffer = NULL;
    int i;

    int TotalLen = 0;
    Displs = malloc(Stream->CohortSize * sizeof(*Displs));

    Displs[0] = 0;
    TotalLen = (RecvCounts[0] + 7) & ~7;

    for (i = 1; i < Stream->CohortSize; i++)
    {
        int round_up = (RecvCounts[i] + 7) & ~7;
        Displs[i] = TotalLen;
        TotalLen += round_up;
    }

    RecvBuffer = malloc(TotalLen * sizeof(char));

    /*
     * Now we have the receive Buffer, counts, and displacements, and
     * can gather the data
     */

    SMPI_Allgatherv(Buffer, (int)DataSize, SMPI_CHAR, RecvBuffer, RecvCounts, Displs, SMPI_CHAR,
                    Stream->mpiComm);
    free_FFSBuffer(Buf);

    FFSContext context = Stream->CPInfo->ffs_c;

    Pointers = malloc(Stream->CohortSize * sizeof(Pointers[0]));
    for (i = 0; i < Stream->CohortSize; i++)
    {
        FFSdecode_in_place(context, RecvBuffer + Displs[i], (void **)&Pointers[i]);
    }
    free(Displs);
    free(RecvCounts);

    *RetDataBlock = RecvBuffer;
    return (void **)Pointers;
}